

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  byte *pbVar8;
  byte *end_00;
  byte *pbVar9;
  
  if (ptr == end) {
    return -4;
  }
  uVar6 = (long)end - (long)ptr;
  end_00 = (byte *)(ptr + (uVar6 & 0xfffffffffffffffe));
  if ((uVar6 & 0xfffffffffffffffe) == 0) {
    end_00 = (byte *)end;
  }
  if ((uVar6 & 1) == 0) {
    end_00 = (byte *)end;
  }
  if (uVar6 == 1) {
    return -1;
  }
  bVar1 = *ptr;
  if (bVar1 - 0xd8 < 4) {
switchD_004892cf_caseD_7:
    if ((long)end_00 - (long)ptr < 4) {
      return -2;
    }
    goto switchD_004892cf_caseD_3;
  }
  if (bVar1 - 0xdc < 4) goto switchD_004892cf_caseD_3;
  iVar3 = 0x12;
  if (bVar1 != 0) {
    if ((bVar1 != 0xff) || ((byte)ptr[1] < 0xfe)) goto switchD_004892cf_caseD_1d;
    goto switchD_004892cf_caseD_3;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[1])) {
  case 2:
    pbVar9 = (byte *)(ptr + 2);
    if (pbVar9 == end_00) {
      return -1;
    }
    bVar1 = *pbVar9;
    if (3 < bVar1 - 0xdc) {
      if (bVar1 == 0) {
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[3]);
        switch(bVar1) {
        case 0xf:
          iVar3 = big2_scanPi(enc,ptr + 4,(char *)end_00,nextTokPtr);
          return iVar3;
        case 0x10:
          pbVar9 = (byte *)(ptr + 4);
          if (pbVar9 == end_00) {
            return -1;
          }
          if (*pbVar9 == 0) {
            switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)ptr[5])) {
            case 0x14:
              *nextTokPtr = ptr + 6;
              return 0x21;
            case 0x16:
            case 0x18:
              ptr = ptr + 6;
LAB_004899e9:
              if ((byte *)ptr == end_00) {
                return -1;
              }
              if (*ptr != 0) goto switchD_004892cf_caseD_3;
              bVar1 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
              switch(bVar1) {
              case 0x15:
                break;
              case 0x16:
              case 0x18:
                goto switchD_00489a1c_caseD_16;
              case 0x17:
              case 0x19:
              case 0x1a:
              case 0x1b:
              case 0x1c:
              case 0x1d:
                goto switchD_004892cf_caseD_3;
              case 0x1e:
                if ((byte *)ptr + 2 == end_00) {
                  return -1;
                }
                if (((((byte *)ptr)[2] == 0) &&
                    (uVar4 = (uint)*(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[3]),
                    uVar4 < 0x1f)) && ((0x40200600U >> (uVar4 & 0x1f) & 1) != 0))
                goto switchD_004892cf_caseD_3;
                break;
              default:
                if (1 < bVar1 - 9) goto switchD_004892cf_caseD_3;
              }
              *nextTokPtr = ptr;
              return 0x10;
            case 0x1b:
              iVar3 = big2_scanComment(enc,ptr + 6,(char *)end_00,nextTokPtr);
              return iVar3;
            }
          }
          break;
        case 0x11:
        case 0x12:
        case 0x13:
        case 0x14:
        case 0x15:
        case 0x17:
          break;
        case 0x16:
        case 0x18:
switchD_00489931_caseD_16:
          *nextTokPtr = ptr;
          return 0x1d;
        default:
          if ((bVar1 - 5 < 3) || (bVar1 == 0x1d)) goto switchD_00489931_caseD_16;
        }
      }
      else if ((bVar1 != 0xff) || ((byte)ptr[3] < 0xfe)) goto switchD_00489931_caseD_16;
    }
switchD_0048938b_caseD_8:
    *nextTokPtr = (char *)pbVar9;
    goto LAB_004894b2;
  default:
    goto switchD_004892cf_caseD_3;
  case 4:
    pbVar9 = (byte *)(ptr + 2);
    if (pbVar9 == end_00) {
      iVar3 = -0x1a;
    }
    else {
      if ((*pbVar9 == 0) && (ptr[3] == ']')) {
        if ((byte *)(ptr + 4) == end_00) {
          return -1;
        }
        if ((ptr[4] == 0) && (ptr[5] == '>')) {
          *nextTokPtr = ptr + 6;
          return 0x22;
        }
      }
      *nextTokPtr = (char *)pbVar9;
      iVar3 = 0x1a;
    }
    break;
  case 5:
switchD_004892cf_caseD_5:
    if ((long)end_00 - (long)ptr < 2) {
      return -2;
    }
    goto switchD_004892cf_caseD_3;
  case 6:
switchD_004892cf_caseD_6:
    if ((long)end_00 - (long)ptr < 3) {
      return -2;
    }
    goto switchD_004892cf_caseD_3;
  case 7:
    goto switchD_004892cf_caseD_7;
  case 9:
    if ((byte *)(ptr + 2) == end_00) {
      return -0xf;
    }
  case 10:
  case 0x15:
    do {
      pbVar9 = (byte *)ptr;
      ptr = (char *)(pbVar9 + 2);
      if (((byte *)ptr == end_00) || (*ptr != 0)) break;
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)pbVar9[3]);
    } while (((cVar2 == '\x15') || (cVar2 == '\n')) || ((cVar2 == '\t' && (pbVar9 + 4 != end_00))));
    *nextTokPtr = ptr;
    iVar3 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 2;
    iVar3 = 0x11;
    break;
  case 0xc:
    iVar3 = 0xc;
    goto LAB_00489663;
  case 0xd:
    iVar3 = 0xd;
LAB_00489663:
    iVar3 = big2_scanLit(iVar3,enc,ptr + 2,(char *)end_00,nextTokPtr);
    return iVar3;
  case 0x13:
    pbVar9 = (byte *)(ptr + 2);
    if (pbVar9 == end_00) {
      return -1;
    }
    bVar1 = *pbVar9;
    iVar5 = 0;
    if (bVar1 - 0xd8 < 4) {
LAB_00489801:
      pbVar8 = end_00 + -(long)pbVar9;
joined_r0x00489808:
      iVar3 = iVar5;
      if ((long)pbVar8 < 4) {
        return -2;
      }
    }
    else {
      iVar3 = 0;
      if (3 < bVar1 - 0xdc) {
        if (bVar1 == 0) {
          bVar7 = ptr[3];
          cVar2 = *(char *)((long)enc[1].scanners + (ulong)bVar7);
          if (cVar2 == '\x05') {
            pbVar8 = end_00 + -(long)pbVar9;
joined_r0x00489a3a:
            iVar3 = iVar5;
            if ((long)pbVar8 < 2) {
              return -2;
            }
          }
          else if (cVar2 == '\x06') {
            pbVar8 = end_00 + -(long)pbVar9;
joined_r0x00489a2b:
            iVar3 = iVar5;
            if ((long)pbVar8 < 3) {
              return -2;
            }
          }
          else {
            if (cVar2 == '\a') goto LAB_00489801;
            if ((cVar2 == '\x16') || (cVar2 == '\x18')) goto LAB_0048984b;
            iVar3 = iVar5;
            if (cVar2 == '\x1d') goto LAB_00489817;
          }
        }
        else {
          if (bVar1 == 0xff) {
            bVar7 = ptr[3];
            if (0xfd < bVar7) goto switchD_00489913_caseD_8;
          }
          else {
            bVar7 = ptr[3];
          }
LAB_00489817:
          iVar3 = iVar5;
          if ((*(uint *)((long)namingBitmap +
                        (ulong)(bVar7 >> 3 & 0x1c | (uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] << 5))
               >> (bVar7 & 0x1f) & 1) != 0) {
LAB_0048984b:
            pbVar9 = (byte *)(ptr + 4);
            pbVar8 = end_00 + (-4 - (long)ptr);
            while( true ) {
              if (pbVar9 == end_00) {
                return -0x14;
              }
              bVar1 = *pbVar9;
              if (bVar1 == 0) break;
              if (bVar1 == 0xff) {
                uVar4 = (uint)pbVar9[1];
                iVar3 = iVar5;
                if (0xfd < pbVar9[1]) goto switchD_00489913_caseD_8;
              }
              else {
                if (bVar1 - 0xd8 < 4) goto switchD_00489913_caseD_7;
                iVar3 = iVar5;
                if (bVar1 - 0xdc < 4) goto switchD_00489913_caseD_8;
                uVar4 = (uint)pbVar9[1];
              }
switchD_00489913_caseD_1d:
              iVar3 = iVar5;
              if ((*(uint *)((long)namingBitmap +
                            (ulong)(uVar4 >> 3 & 0x1c |
                                   (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5)) >>
                   (uVar4 & 0x1f) & 1) == 0) goto switchD_00489913_caseD_8;
switchD_00489913_caseD_16:
              pbVar9 = pbVar9 + 2;
              pbVar8 = pbVar8 + -2;
            }
            uVar4 = (uint)pbVar9[1];
            iVar3 = iVar5;
            switch(*(undefined1 *)((long)enc[1].scanners + (ulong)pbVar9[1])) {
            case 5:
              goto joined_r0x00489a3a;
            case 6:
              goto joined_r0x00489a2b;
            case 7:
switchD_00489913_caseD_7:
              goto joined_r0x00489808;
            default:
              break;
            case 9:
            case 10:
            case 0xb:
            case 0x15:
            case 0x1e:
            case 0x20:
            case 0x24:
              iVar3 = 0x14;
              break;
            case 0x16:
            case 0x18:
            case 0x19:
            case 0x1a:
            case 0x1b:
              goto switchD_00489913_caseD_16;
            case 0x1d:
              goto switchD_00489913_caseD_1d;
            }
          }
        }
      }
    }
switchD_00489913_caseD_8:
    *nextTokPtr = (char *)pbVar9;
    break;
  case 0x14:
    *nextTokPtr = ptr + 2;
    iVar3 = 0x19;
    break;
  case 0x16:
  case 0x18:
    goto switchD_004892cf_caseD_16;
  case 0x17:
  case 0x19:
  case 0x1a:
  case 0x1b:
    iVar3 = 0x13;
    goto switchD_004892cf_caseD_16;
  case 0x1d:
switchD_004892cf_caseD_1d:
    bVar7 = ptr[1];
    if (((*(uint *)((long)namingBitmap +
                   (ulong)((uint)"\x02\x03\x04\x05\x06\a\b"[bVar1] * 0x20 + (uint)(bVar7 >> 5) * 4))
          >> (bVar7 & 0x1f) & 1) != 0) ||
       (iVar3 = 0x13,
       (*(uint *)((long)namingBitmap +
                 (ulong)((uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] * 0x20 + (uint)(bVar7 >> 5) * 4
                        )) & 1 << (bVar7 & 0x1f)) != 0)) goto switchD_004892cf_caseD_16;
switchD_004892cf_caseD_3:
    *nextTokPtr = ptr;
LAB_004894b2:
    iVar3 = 0;
    break;
  case 0x1e:
    iVar3 = big2_scanPercent(enc,ptr + 2,(char *)end_00,nextTokPtr);
    return iVar3;
  case 0x1f:
    *nextTokPtr = ptr + 2;
    iVar3 = 0x17;
    break;
  case 0x20:
    pbVar9 = (byte *)(ptr + 2);
    if (pbVar9 == end_00) {
      return -0x18;
    }
    if (*pbVar9 == 0) {
      bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)ptr[3]);
      switch(bVar1) {
      case 0x20:
      case 0x23:
      case 0x24:
switchD_00489780_caseD_20:
        *nextTokPtr = (char *)pbVar9;
        return 0x18;
      case 0x21:
        *nextTokPtr = ptr + 4;
        return 0x24;
      case 0x22:
        *nextTokPtr = ptr + 4;
        return 0x25;
      default:
        if (bVar1 - 9 < 3) goto switchD_00489780_caseD_20;
      }
      if (bVar1 == 0xf) {
        *nextTokPtr = ptr + 4;
        return 0x23;
      }
      if (bVar1 == 0x15) goto switchD_00489780_caseD_20;
    }
    *nextTokPtr = (char *)pbVar9;
    goto LAB_004894b2;
  case 0x23:
    *nextTokPtr = ptr + 2;
    iVar3 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 2;
    iVar3 = 0x15;
  }
  return iVar3;
switchD_004892cf_caseD_16:
  ptr = ptr + 2;
LAB_004892f2:
  while( true ) {
    pbVar9 = (byte *)ptr;
    if (pbVar9 == end_00) {
      return -iVar3;
    }
    bVar1 = *pbVar9;
    if (bVar1 == 0) break;
    if (bVar1 == 0xff) {
      if (0xfd < pbVar9[1]) goto switchD_0048938b_caseD_8;
    }
    else {
      if (bVar1 - 0xd8 < 4) goto switchD_0048938b_caseD_7;
      if (bVar1 - 0xdc < 4) goto switchD_0048938b_caseD_8;
    }
switchD_0048938b_caseD_1d:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(pbVar9[1] >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5))
         >> (pbVar9[1] & 0x1f) & 1) == 0) goto switchD_0048938b_caseD_8;
switchD_0048938b_caseD_16:
    ptr = (char *)(pbVar9 + 2);
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)pbVar9[1])) {
  case 5:
    if ((long)end_00 - (long)pbVar9 < 2) {
      return -2;
    }
    goto switchD_0048938b_caseD_8;
  case 6:
    if ((long)end_00 - (long)pbVar9 < 3) {
      return -2;
    }
    goto switchD_0048938b_caseD_8;
  case 7:
switchD_0048938b_caseD_7:
    if ((long)end_00 - (long)pbVar9 < 4) {
      return -2;
    }
  default:
    goto switchD_0048938b_caseD_8;
  case 9:
  case 10:
  case 0xb:
  case 0x14:
  case 0x15:
  case 0x1e:
  case 0x20:
  case 0x23:
  case 0x24:
    *nextTokPtr = (char *)pbVar9;
    return iVar3;
  case 0xf:
    if (iVar3 != 0x13) {
      *nextTokPtr = (char *)(pbVar9 + 2);
      return 0x1e;
    }
    goto switchD_0048938b_caseD_8;
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    goto switchD_0048938b_caseD_16;
  case 0x17:
    break;
  case 0x1d:
    goto switchD_0048938b_caseD_1d;
  case 0x21:
    if (iVar3 != 0x13) {
      *nextTokPtr = (char *)(pbVar9 + 2);
      return 0x1f;
    }
    goto switchD_0048938b_caseD_8;
  case 0x22:
    if (iVar3 != 0x13) {
      *nextTokPtr = (char *)(pbVar9 + 2);
      return 0x20;
    }
    goto switchD_0048938b_caseD_8;
  }
  ptr = (char *)(pbVar9 + 2);
  if (iVar3 == 0x29) {
    iVar3 = 0x13;
    goto LAB_004892f2;
  }
  if (iVar3 != 0x12) goto LAB_004892f2;
  if ((byte *)ptr == end_00) {
    return -1;
  }
  bVar1 = *ptr;
  iVar3 = 0x13;
  if (bVar1 - 0xdc < 4) goto LAB_004892f2;
  if (bVar1 != 0) {
    if (bVar1 == 0xff) {
      iVar3 = 0x13;
      if (0xfd < pbVar9[3]) goto LAB_004892f2;
    }
    else if (bVar1 - 0xd8 < 4) goto switchD_004892cf_caseD_7;
LAB_0048943e:
    if ((*(uint *)((long)namingBitmap +
                  (ulong)(pbVar9[3] >> 3 & 0x1c | (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar1] << 5))
         >> (pbVar9[3] & 0x1f) & 1) == 0) goto switchD_004892cf_caseD_3;
LAB_00489463:
    iVar3 = 0x29;
    ptr = (char *)(pbVar9 + 4);
    goto LAB_004892f2;
  }
  bVar7 = *(byte *)((long)enc[1].scanners + (ulong)pbVar9[3]);
  if ((bVar7 - 0x18 < 4) || (bVar7 == 0x16)) goto LAB_00489463;
  if (bVar7 == 0x1d) goto LAB_0048943e;
  if (bVar7 == 5) goto switchD_004892cf_caseD_5;
  if (bVar7 == 6) goto switchD_004892cf_caseD_6;
  iVar3 = 0x13;
  if (bVar7 == 7) goto switchD_004892cf_caseD_7;
  goto LAB_004892f2;
switchD_00489a1c_caseD_16:
  ptr = (char *)((byte *)ptr + 2);
  goto LAB_004899e9;
}

Assistant:

static
int PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                      const char **nextTokPtr)
{
  int tok;
  if (ptr == end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT:
    {
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_EXCL:
        return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_QUEST:
        return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
      case BT_NMSTRT:
      case BT_HEX:
      case BT_NONASCII:
      case BT_LEAD2:
      case BT_LEAD3:
      case BT_LEAD4:
        *nextTokPtr = ptr - MINBPC(enc);
        return XML_TOK_INSTANCE_START;
      }
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  case BT_CR:
    if (ptr + MINBPC(enc) == end)
      return -XML_TOK_PROLOG_S;
    /* fall through */
  case BT_S: case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (ptr == end)
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (ptr == end)
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      if (ptr + MINBPC(enc) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2*MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (ptr == end)
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR: case BT_LF: case BT_S:
    case BT_GT: case BT_COMMA: case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#define LEAD_CASE(n) \
  case BT_LEAD ## n: \
    if (end - ptr < n) \
      return XML_TOK_PARTIAL_CHAR; \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NAME; \
      break; \
    } \
    if (IS_NAME_CHAR(enc, ptr, n)) { \
      ptr += n; \
      tok = XML_TOK_NMTOKEN; \
      break; \
    } \
    *nextTokPtr = ptr; \
    return XML_TOK_INVALID;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#ifdef XML_NS
  case BT_COLON:
#endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT: case BT_RPAR: case BT_COMMA:
    case BT_VERBAR: case BT_LSQB: case BT_PERCNT:
    case BT_S: case BT_CR: case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        if (ptr == end)
          return XML_TOK_PARTIAL;
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
        CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN)  {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}